

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O0

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeSingleThreadedImpl
          (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *this)

{
  bool bVar1;
  eAssertResult eVar2;
  size_type sVar3;
  __int_type_conflict _Var4;
  reference this_00;
  size_type local_28;
  size_t i;
  eAssertResult assertResult;
  size_type taskCount;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)0,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *this_local;
  
  bVar1 = task_base::tryGrab((task_base *)this);
  if (bVar1) {
    sVar3 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::size(&this->tasks_);
    if ((sVar3 != 0) ||
       (bVar1 = assert_and_return_false
                          ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                           ,0x34,"taskCount > 0",""), bVar1)) {
      if (((executeSingleThreadedImpl::always_ignore & 1U) == 0) &&
         (_Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base *)&this->activeTasksCount_), sVar3 != _Var4)) {
        eVar2 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                                ,0x36,"(taskCount == activeTasksCount_)","");
        if (eVar2 == eAR_Retry) {
          debugger_break();
        }
        else if (eVar2 == eAR_AlwaysIgnore) {
          executeSingleThreadedImpl::always_ignore = true;
        }
      }
      for (local_28 = 0; local_28 < sVar3; local_28 = local_28 + 1) {
        this_00 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                            (&this->tasks_,local_28);
        task_handle::executeSingleThreaded(this_00);
      }
    }
    std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::clear(&this->tasks_);
  }
  return;
}

Assistant:

virtual void executeSingleThreadedImpl() override final
        {
            if (task_base::tryGrab())
            {
                const auto taskCount = tasks_.size();
                if (oqpi_ensure(taskCount > 0))
                {
                    oqpi_check(taskCount == activeTasksCount_);
                    for (size_t i = 0; i < taskCount; ++i)
                    {
                        tasks_[i].executeSingleThreaded();
                    }
                }
                tasks_.clear();
            }
        }